

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

Symbol * __thiscall
slang::ast::anon_unknown_0::AnsiPortListBuilder::add
          (AnsiPortListBuilder *this,DeclaratorSyntax *decl,ArgumentDirection direction,
          DataTypeSyntax *type,NetType *netType,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs)

{
  int iVar1;
  Compilation *this_00;
  EqualsValueClauseSyntax *this_01;
  ExpressionSyntax *pEVar2;
  size_t sVar3;
  NetType *pNVar4;
  PortSymbol *this_02;
  Diagnostic *this_03;
  Symbol *pSVar5;
  SourceLocation SVar6;
  DiagCode code;
  Scope *pSVar7;
  SourceRange sourceRange;
  SourceLocation local_60;
  string_view local_58;
  ArgumentDirection local_48;
  bool local_44 [4];
  DataTypeSyntax *local_40;
  NetType *local_38;
  
  this_00 = this->comp;
  local_40 = type;
  local_38 = netType;
  local_58 = parsing::Token::valueText(&decl->name);
  local_60 = parsing::Token::location(&decl->name);
  local_44[0] = true;
  this_02 = BumpAllocator::
            emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,bool>
                      (&this_00->super_BumpAllocator,&local_58,&local_60,local_44);
  local_58._M_len = (size_t)this_02;
  this_02->direction = direction;
  (this_02->super_Symbol).originatingSyntax = &decl->super_SyntaxNode;
  local_48 = direction;
  Symbol::setAttributes(&this_02->super_Symbol,this->scope,attrs);
  if (*(long *)(local_58._M_len + 8) != 0) {
    iVar1 = *(int *)(local_58._M_len + 0x50);
    if (local_38 == (NetType *)0x0 && iVar1 == 2) {
      pSVar7 = this->scope;
      SVar6 = *(SourceLocation *)(local_58._M_len + 0x18);
      code.subsystem = Declarations;
      code.code = 0x49;
    }
    else if ((iVar1 == 2) && (local_38->netKind == UWire)) {
      pSVar7 = this->scope;
      SVar6 = *(SourceLocation *)(local_58._M_len + 0x18);
      code.subsystem = Declarations;
      code.code = 0x4a;
    }
    else {
      if (iVar1 != 3 || local_38 == (NetType *)0x0) goto LAB_007d8005;
      pSVar7 = this->scope;
      SVar6 = *(SourceLocation *)(local_58._M_len + 0x18);
      code.subsystem = Declarations;
      code.code = 0xbc;
    }
    this_03 = Scope::addDiag(pSVar7,code,SVar6);
    Diagnostic::operator<<(this_03,*(string_view *)(local_58._M_len + 8));
  }
LAB_007d8005:
  if (((this->comp->options).flags.m_bits & 0x2000) != 0) {
    pSVar5 = Scope::find(this->scope,*(string_view *)(local_58._M_len + 8));
    if ((pSVar5 != (Symbol *)0x0) && (pSVar5->kind - Net < 2)) {
      *(Symbol **)(local_58._M_len + 0x40) = pSVar5;
    }
  }
  pNVar4 = local_38;
  if (*(long *)(local_58._M_len + 0x40) != 0) goto LAB_007d80f5;
  if (local_38 == (NetType *)0x0) {
    local_44[0] = true;
    local_44[1] = false;
    local_44[2] = false;
    local_44[3] = false;
    local_60 = (SourceLocation)
               BumpAllocator::
               emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::VariableLifetime>
                         (&this->comp->super_BumpAllocator,
                          (basic_string_view<char,_std::char_traits<char>_> *)(local_58._M_len + 8),
                          (SourceLocation *)(local_58._M_len + 0x18),(VariableLifetime *)local_44);
  }
  else {
    local_60 = (SourceLocation)
               BumpAllocator::
               emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                         (&this->comp->super_BumpAllocator,
                          (basic_string_view<char,_std::char_traits<char>_> *)(local_58._M_len + 8),
                          (SourceLocation *)(local_58._M_len + 0x18),local_38);
  }
  if (local_40 == (DataTypeSyntax *)0x0) {
    if ((decl->dimensions).
        super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
        _M_extent_value != 0) goto LAB_007d80b8;
  }
  else {
    *(DataTypeSyntax **)((long)local_60 + 0x50) = local_40;
    *(byte *)((long)local_60 + 0x7f) = *(byte *)((long)local_60 + 0x7f) & 0x7f;
LAB_007d80b8:
    DeclaredType::setDimensionSyntax((DeclaredType *)((long)local_60 + 0x40),&decl->dimensions);
  }
  *(DeclaratorSyntax **)((long)local_60 + 0x38) = decl;
  Symbol::setAttributes((Symbol *)local_60,this->scope,attrs);
  *(SourceLocation *)(local_58._M_len + 0x40) = local_60;
  SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
  emplace_back<slang::ast::ValueSymbol*&,slang::ast::PortSymbol*&>
            ((SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *)
             this->implicitMembers,(ValueSymbol **)&local_60,(PortSymbol **)&local_58);
LAB_007d80f5:
  sVar3 = local_58._M_len;
  this_01 = decl->initializer;
  if (this_01 != (EqualsValueClauseSyntax *)0x0) {
    if ((pNVar4 == (NetType *)0x0) || (pNVar4->netKind != Interconnect)) {
      pEVar2 = (this_01->expr).ptr;
      SVar6 = parsing::Token::location(&this_01->equals);
      *(ExpressionSyntax **)&((Symbol *)(sVar3 + 0x40))->indexInScope = pEVar2;
      ((Symbol *)(sVar3 + 0x40))->originatingSyntax = (SyntaxNode *)SVar6;
    }
    else {
      pSVar7 = this->scope;
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&this_01->super_SyntaxNode);
      Scope::addDiag(pSVar7,(DiagCode)0x650005,sourceRange);
    }
  }
  this->lastDirection = local_48;
  this->lastType = local_40;
  this->lastNetType = pNVar4;
  this->lastInterface = (DefinitionSymbol *)0x0;
  (this->lastModport)._M_len = 0;
  (this->lastModport)._M_str = "";
  this->lastGenericIface = false;
  return (Symbol *)local_58._M_len;
}

Assistant:

Symbol* add(const DeclaratorSyntax& decl, ArgumentDirection direction,
                const DataTypeSyntax* type, const NetType* netType,
                std::span<const AttributeInstanceSyntax* const> attrs) {
        auto port = comp.emplace<PortSymbol>(decl.name.valueText(), decl.name.location(),
                                             /* isAnsiPort */ true);
        port->direction = direction;
        port->setSyntax(decl);
        port->setAttributes(scope, attrs);

        if (!port->name.empty()) {
            if (port->direction == ArgumentDirection::InOut && !netType) {
                scope.addDiag(diag::InOutPortCannotBeVariable, port->location) << port->name;
            }
            else if (port->direction == ArgumentDirection::InOut &&
                     netType->netKind == NetType::UWire) {
                scope.addDiag(diag::InOutUWirePort, port->location) << port->name;
            }
            else if (port->direction == ArgumentDirection::Ref && netType) {
                scope.addDiag(diag::RefPortMustBeVariable, port->location) << port->name;
            }
        }

        // Support a compatibility option which allows ANSI ports to still look
        // up and connect to an identically named net or variable declared in
        // the definition body instead of creating a new symbol internally.
        if (comp.hasFlag(CompilationFlags::AllowMergingAnsiPorts)) {
            if (auto symbol = scope.find(port->name);
                symbol &&
                (symbol->kind == SymbolKind::Variable || symbol->kind == SymbolKind::Net)) {
                port->internalSymbol = symbol;
            }
        }

        // Create a new symbol to represent this port internally to the instance.
        if (!port->internalSymbol) {
            ValueSymbol* symbol;
            if (netType) {
                symbol = comp.emplace<NetSymbol>(port->name, port->location, *netType);
            }
            else {
                symbol = comp.emplace<VariableSymbol>(port->name, port->location,
                                                      VariableLifetime::Static);
            }

            if (type) {
                symbol->setDeclaredType(*type, decl.dimensions);
            }
            else {
                SLANG_ASSERT(netType);
                if (!decl.dimensions.empty())
                    symbol->getDeclaredType()->setDimensionSyntax(decl.dimensions);
            }

            symbol->setSyntax(decl);
            symbol->setAttributes(scope, attrs);
            port->internalSymbol = symbol;
            implicitMembers.emplace_back(symbol, port);
        }

        if (decl.initializer) {
            if (netType && netType->netKind == NetType::Interconnect) {
                scope.addDiag(diag::InterconnectInitializer, decl.initializer->sourceRange());
            }
            else {
                port->setInitializerSyntax(*decl.initializer->expr,
                                           decl.initializer->equals.location());
            }
        }

        // Remember the properties of this port in case the next port wants to inherit from it.
        lastDirection = direction;
        lastType = type;
        lastNetType = netType;
        lastInterface = nullptr;
        lastModport = ""sv;
        lastGenericIface = false;

        return port;
    }